

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void * CSocekt::ServerSendQueueThread(void *threadData)

{
  const_iterator __position;
  const_iterator __position_00;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  int *piVar4;
  reference ppcVar5;
  long in_RDI;
  MutexLockGuard lock;
  CMemory *p_memory;
  ssize_t sendsize;
  unsigned_short itmp;
  lp_connection_t p_Conn;
  LPCOMM_PKG_HEADER pPkgHeader;
  LPSTRUC_MSG_HEADER pMsgHeader;
  char *pMsgBuf;
  iterator posend;
  iterator pos2;
  iterator pos;
  int err;
  CSocekt *pSocketObj;
  ThreadItem *pThread;
  LogLevel in_stack_ffffffffffff9f18;
  uint in_stack_ffffffffffff9f1c;
  CMemory *in_stack_ffffffffffff9f20;
  undefined4 in_stack_ffffffffffff9f28;
  int in_stack_ffffffffffff9f2c;
  SourceFile *in_stack_ffffffffffff9f30;
  Logger *in_stack_ffffffffffff9f50;
  ssize_t in_stack_ffffffffffffaf20;
  char *in_stack_ffffffffffffaf28;
  lp_connection_t in_stack_ffffffffffffaf30;
  int in_stack_ffffffffffffaf38;
  uint32_t in_stack_ffffffffffffaf3c;
  uint32_t in_stack_ffffffffffffaf40;
  int in_stack_ffffffffffffaf44;
  CSocekt *in_stack_ffffffffffffaf48;
  Logger local_5048;
  Logger local_4060;
  Logger local_3078;
  Logger local_2090;
  _List_node_base *local_10b8;
  _List_const_iterator<char_*> local_10b0;
  _List_node_base *local_10a8;
  _List_node_base *local_10a0;
  _List_node_base *local_1098;
  _List_const_iterator<char_*> local_1090;
  _List_node_base *local_1088;
  _List_node_base *local_1080;
  _List_node_base *local_1078;
  Logger local_1048;
  CMemory *local_70;
  ulong local_68;
  uint16_t local_5a;
  long local_58;
  uint16_t *local_50;
  long *local_48;
  long *local_40;
  _List_iterator<char_*> local_38;
  _List_iterator<char_*> local_30;
  _List_iterator<char_*> local_28 [2];
  long local_18;
  
  local_18 = *(long *)(in_RDI + 8);
  std::_List_iterator<char_*>::_List_iterator(local_28);
  std::_List_iterator<char_*>::_List_iterator(&local_30);
  std::_List_iterator<char_*>::_List_iterator(&local_38);
  local_70 = CMemory::GetInstance();
  while( true ) {
    if (g_stopEvent != 0) {
      return (void *)0x0;
    }
    iVar2 = sem_wait((sem_t *)(local_18 + 0x19c8));
    if ((iVar2 == -1) && (piVar4 = __errno_location(), *piVar4 != 4)) {
      muduo::Logger::SourceFile::SourceFile<100>
                (in_stack_ffffffffffff9f30,
                 (char (*) [100])CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
      file.data_._4_4_ = in_stack_ffffffffffff9f2c;
      file.data_._0_4_ = in_stack_ffffffffffff9f28;
      file._8_8_ = in_stack_ffffffffffff9f30;
      muduo::Logger::Logger
                ((Logger *)in_stack_ffffffffffff9f20,file,in_stack_ffffffffffff9f1c,
                 in_stack_ffffffffffff9f18);
      muduo::Logger::stream(&local_1048);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff9f30,
                 (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
      muduo::Logger::~Logger(in_stack_ffffffffffff9f50);
    }
    if (g_stopEvent != 0) break;
    iVar2 = muduo::detail::AtomicIntegerT<int>::get((AtomicIntegerT<int> *)(local_18 + 0x1960));
    if (0 < iVar2) {
      muduo::MutexLockGuard::MutexLockGuard
                ((MutexLockGuard *)in_stack_ffffffffffff9f20,
                 (MutexLock *)CONCAT44(in_stack_ffffffffffff9f1c,in_stack_ffffffffffff9f18));
      local_1078 = (_List_node_base *)
                   std::__cxx11::list<char_*,_std::allocator<char_*>_>::begin
                             ((list<char_*,_std::allocator<char_*>_> *)
                              CONCAT44(in_stack_ffffffffffff9f1c,in_stack_ffffffffffff9f18));
      local_28[0]._M_node = local_1078;
      local_1080 = (_List_node_base *)
                   std::__cxx11::list<char_*,_std::allocator<char_*>_>::end
                             ((list<char_*,_std::allocator<char_*>_> *)
                              CONCAT44(in_stack_ffffffffffff9f1c,in_stack_ffffffffffff9f18));
      local_38._M_node = local_1080;
      while (bVar1 = std::operator!=(local_28,&local_38), bVar1) {
        ppcVar5 = std::_List_iterator<char_*>::operator*((_List_iterator<char_*> *)0x139dc6);
        local_48 = (long *)*ppcVar5;
        local_50 = (uint16_t *)((long)local_48 + *(long *)(local_18 + 0x10));
        local_58 = *local_48;
        local_40 = local_48;
        if (*(long *)(local_58 + 0x20) == local_48[1]) {
          iVar2 = muduo::detail::AtomicIntegerT<int>::get((AtomicIntegerT<int> *)(local_58 + 0xe0));
          if (iVar2 < 1) {
            *(long **)(local_58 + 0xe8) = local_40;
            local_30._M_node = local_28[0]._M_node;
            local_10a8 = (_List_node_base *)std::_List_iterator<char_*>::operator++(local_28,0);
            std::_List_const_iterator<char_*>::_List_const_iterator(&local_10b0,&local_30);
            __position_00._M_node._4_4_ = in_stack_ffffffffffff9f2c;
            __position_00._M_node._0_4_ = in_stack_ffffffffffff9f28;
            local_10b8 = (_List_node_base *)
                         std::__cxx11::list<char_*,_std::allocator<char_*>_>::erase
                                   ((list<char_*,_std::allocator<char_*>_> *)
                                    in_stack_ffffffffffff9f20,__position_00);
            muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x139fc7);
            *(uint16_t **)(local_58 + 0xf0) = local_50;
            local_5a = ntohs(*local_50);
            *(uint *)(local_58 + 0xf8) = (uint)local_5a;
            LVar3 = muduo::Logger::logLevel();
            if ((int)LVar3 < 3) {
              muduo::Logger::SourceFile::SourceFile<100>
                        (in_stack_ffffffffffff9f30,
                         (char (*) [100])
                         CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
              file_00.data_._4_4_ = in_stack_ffffffffffff9f2c;
              file_00.data_._0_4_ = in_stack_ffffffffffff9f28;
              file_00._8_8_ = in_stack_ffffffffffff9f30;
              muduo::Logger::Logger
                        ((Logger *)in_stack_ffffffffffff9f20,file_00,in_stack_ffffffffffff9f1c);
              muduo::Logger::stream(&local_2090);
              muduo::LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffff9f30,
                         (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
              muduo::LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffff9f20,in_stack_ffffffffffff9f1c);
              muduo::Logger::~Logger(in_stack_ffffffffffff9f50);
            }
            local_68 = sendproc((CSocekt *)
                                CONCAT44(in_stack_ffffffffffffaf3c,in_stack_ffffffffffffaf38),
                                in_stack_ffffffffffffaf30,in_stack_ffffffffffffaf28,
                                in_stack_ffffffffffffaf20);
            if ((long)local_68 < 1) {
              if (local_68 == 0) {
                CMemory::FreeMemory(in_stack_ffffffffffff9f20,
                                    (void *)CONCAT44(in_stack_ffffffffffff9f1c,
                                                     in_stack_ffffffffffff9f18));
                *(undefined8 *)(local_58 + 0xe8) = 0;
              }
              else if (local_68 == 0xffffffffffffffff) {
                muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x13a4b7);
                in_stack_ffffffffffff9f2c =
                     flyd_epoll_oper_event
                               (in_stack_ffffffffffffaf48,in_stack_ffffffffffffaf44,
                                in_stack_ffffffffffffaf40,in_stack_ffffffffffffaf3c,
                                in_stack_ffffffffffffaf38,in_stack_ffffffffffffaf30);
                if (in_stack_ffffffffffff9f2c == -1) {
                  muduo::Logger::SourceFile::SourceFile<100>
                            (in_stack_ffffffffffff9f30,
                             (char (*) [100])CONCAT44(0xffffffff,in_stack_ffffffffffff9f28));
                  file_04.data_._4_4_ = in_stack_ffffffffffff9f2c;
                  file_04.data_._0_4_ = in_stack_ffffffffffff9f28;
                  file_04._8_8_ = in_stack_ffffffffffff9f30;
                  muduo::Logger::Logger
                            ((Logger *)in_stack_ffffffffffff9f20,file_04,in_stack_ffffffffffff9f1c,
                             in_stack_ffffffffffff9f18);
                  in_stack_ffffffffffff9f20 =
                       (CMemory *)muduo::Logger::stream((Logger *)&stack0xffffffffffff9fd0);
                  muduo::LogStream::operator<<
                            ((LogStream *)in_stack_ffffffffffff9f30,
                             (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
                  muduo::Logger::~Logger(in_stack_ffffffffffff9f50);
                }
              }
              else {
                CMemory::FreeMemory(in_stack_ffffffffffff9f20,
                                    (void *)CONCAT44(in_stack_ffffffffffff9f1c,
                                                     in_stack_ffffffffffff9f18));
                *(undefined8 *)(local_58 + 0xe8) = 0;
              }
            }
            else if (local_68 == *(uint *)(local_58 + 0xf8)) {
              CMemory::FreeMemory(in_stack_ffffffffffff9f20,
                                  (void *)CONCAT44(in_stack_ffffffffffff9f1c,
                                                   in_stack_ffffffffffff9f18));
              *(undefined8 *)(local_58 + 0xe8) = 0;
              LVar3 = muduo::Logger::logLevel();
              if ((int)LVar3 < 3) {
                muduo::Logger::SourceFile::SourceFile<100>
                          (in_stack_ffffffffffff9f30,
                           (char (*) [100])
                           CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
                file_01.data_._4_4_ = in_stack_ffffffffffff9f2c;
                file_01.data_._0_4_ = in_stack_ffffffffffff9f28;
                file_01._8_8_ = in_stack_ffffffffffff9f30;
                muduo::Logger::Logger
                          ((Logger *)in_stack_ffffffffffff9f20,file_01,in_stack_ffffffffffff9f1c);
                muduo::Logger::stream(&local_3078);
                muduo::LogStream::operator<<
                          ((LogStream *)in_stack_ffffffffffff9f30,
                           (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
                muduo::Logger::~Logger(in_stack_ffffffffffff9f50);
              }
            }
            else {
              *(ulong *)(local_58 + 0xf0) = *(long *)(local_58 + 0xf0) + local_68;
              *(int *)(local_58 + 0xf8) = *(int *)(local_58 + 0xf8) - (int)local_68;
              muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x13a275);
              iVar2 = flyd_epoll_oper_event
                                (in_stack_ffffffffffffaf48,in_stack_ffffffffffffaf44,
                                 in_stack_ffffffffffffaf40,in_stack_ffffffffffffaf3c,
                                 in_stack_ffffffffffffaf38,in_stack_ffffffffffffaf30);
              if (iVar2 == -1) {
                muduo::Logger::SourceFile::SourceFile<100>
                          (in_stack_ffffffffffff9f30,
                           (char (*) [100])
                           CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
                file_02.data_._4_4_ = in_stack_ffffffffffff9f2c;
                file_02.data_._0_4_ = in_stack_ffffffffffff9f28;
                file_02._8_8_ = in_stack_ffffffffffff9f30;
                muduo::Logger::Logger
                          ((Logger *)in_stack_ffffffffffff9f20,file_02,in_stack_ffffffffffff9f1c,
                           in_stack_ffffffffffff9f18);
                muduo::Logger::stream(&local_4060);
                muduo::LogStream::operator<<
                          ((LogStream *)in_stack_ffffffffffff9f30,
                           (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
                muduo::Logger::~Logger(in_stack_ffffffffffff9f50);
              }
              muduo::Logger::SourceFile::SourceFile<100>
                        (in_stack_ffffffffffff9f30,
                         (char (*) [100])
                         CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
              file_03.data_._4_4_ = in_stack_ffffffffffff9f2c;
              file_03.data_._0_4_ = in_stack_ffffffffffff9f28;
              file_03._8_8_ = in_stack_ffffffffffff9f30;
              muduo::Logger::Logger
                        ((Logger *)in_stack_ffffffffffff9f20,file_03,in_stack_ffffffffffff9f1c,
                         in_stack_ffffffffffff9f18);
              in_stack_ffffffffffff9f50 = (Logger *)muduo::Logger::stream(&local_5048);
              muduo::LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffff9f30,
                         (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
              muduo::LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffff9f20,in_stack_ffffffffffff9f1c);
              muduo::LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffff9f30,
                         (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28));
              in_stack_ffffffffffff9f30 =
                   (SourceFile *)
                   muduo::LogStream::operator<<
                             ((LogStream *)in_stack_ffffffffffff9f30,
                              (char *)CONCAT44(in_stack_ffffffffffff9f2c,in_stack_ffffffffffff9f28))
              ;
              muduo::LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffff9f20,
                         CONCAT44(in_stack_ffffffffffff9f1c,in_stack_ffffffffffff9f18));
              muduo::Logger::~Logger(in_stack_ffffffffffff9f50);
            }
          }
          else {
            local_10a0 = (_List_node_base *)std::_List_iterator<char_*>::operator++(local_28,0);
          }
        }
        else {
          local_30._M_node = local_28[0]._M_node;
          local_1088 = (_List_node_base *)std::_List_iterator<char_*>::operator++(local_28,0);
          std::_List_const_iterator<char_*>::_List_const_iterator(&local_1090,&local_30);
          __position._M_node._4_4_ = in_stack_ffffffffffff9f2c;
          __position._M_node._0_4_ = in_stack_ffffffffffff9f28;
          local_1098 = (_List_node_base *)
                       std::__cxx11::list<char_*,_std::allocator<char_*>_>::erase
                                 ((list<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffff9f20
                                  ,__position);
          muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x139eb1);
          CMemory::FreeMemory(in_stack_ffffffffffff9f20,
                              (void *)CONCAT44(in_stack_ffffffffffff9f1c,in_stack_ffffffffffff9f18))
          ;
        }
      }
      muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13a5d2);
    }
  }
  return (void *)0x0;
}

Assistant:

void* CSocekt::ServerSendQueueThread(void* threadData)
{    
    ThreadItem *pThread = static_cast<ThreadItem*>(threadData);
    CSocekt *pSocketObj = pThread->_pThis;
    int err;
    std::list <char *>::iterator pos,pos2,posend;
    
    char *pMsgBuf;	
    LPSTRUC_MSG_HEADER	pMsgHeader;
	LPCOMM_PKG_HEADER   pPkgHeader;
    lp_connection_t     p_Conn;
    unsigned short      itmp;
    ssize_t             sendsize;  

    CMemory *p_memory = CMemory::GetInstance();
    
    while(g_stopEvent == 0) //不退出
    {
        //如果信号量值>0，则 -1(减1) 并走下去，否则卡这里卡着【为了让信号量值+1，可以在其他线程调用sem_post达到，实际上在CSocekt::msgSend()调用sem_post就达到了让这里sem_wait走下去的目的】
        //******如果被某个信号中断，sem_wait也可能过早的返回，错误为EINTR；
        //整个程序退出之前，也要sem_post()一下，确保如果本线程卡在sem_wait()，也能走下去从而让本线程成功返回
        if(sem_wait(&pSocketObj->m_semEventSendQueue) == -1)
        {
            //失败？及时报告，其他的也不好干啥
            if(errno != EINTR) //这个我就不算个错误了【当阻塞于某个慢系统调用的一个进程捕获某个信号且相应信号处理函数返回时，该系统调用可能返回一个EINTR错误。】
                LOG_ERROR << "CSocekt::ServerSendQueueThread()中sem_wait(&pSocketObj->m_semEventSendQueue)失败.";
        }

        //一般走到这里都表示需要处理数据收发了
        if(g_stopEvent != 0)  //要求整个进程退出
            break;

        if(pSocketObj->m_iSendMsgQueueCount.get() > 0) //原子的 
        {
            muduo::MutexLockGuard lock(pSocketObj->m_sendMessageQueueMutex);
            pos    = pSocketObj->m_MsgSendQueue.begin();
			posend = pSocketObj->m_MsgSendQueue.end();

            while(pos != posend)
            {
                pMsgBuf = (*pos);                          //拿到的每个消息都是 消息头+包头+包体【但要注意，我们是不发送消息头给客户端的】
                pMsgHeader = (LPSTRUC_MSG_HEADER)pMsgBuf;  //指向消息头
                pPkgHeader = (LPCOMM_PKG_HEADER)(pMsgBuf+pSocketObj->m_iLenMsgHeader);	//指向包头
                p_Conn = pMsgHeader->pConn;

                //包过期，因为如果 这个连接被回收，比如在ngx_close_connection(),inRecyConnectQueue()中都会自增iCurrsequence
                     //而且这里有没必要针对 本连接 来用m_connectionMutex临界 ,只要下面条件成立，肯定是客户端连接已断，要发送的数据肯定不需要发送了
                if(p_Conn->iCurrsequence != pMsgHeader->iCurrsequence) 
                {
                    //本包中保存的序列号与p_Conn【连接池中连接】中实际的序列号已经不同，丢弃此消息，小心处理该消息的删除
                    pos2=pos;
                    pos++;
                    pSocketObj->m_MsgSendQueue.erase(pos2);
                    pSocketObj->m_iSendMsgQueueCount.decrement(); //发送消息队列容量少1		
                    p_memory->FreeMemory(pMsgBuf);	
                    continue;
                } //end if

                if(p_Conn->iThrowsendCount.get() > 0) 
                {
                    //靠系统驱动来发送消息，所以这里不能再发送
                    pos++;
                    continue;
                }
            
                //走到这里，可以发送消息，一些必须的信息记录，要发送的东西也要从发送队列里干掉
                p_Conn->psendMemPointer = pMsgBuf;      //发送后释放用的，因为这段内存是new出来的
                pos2=pos;
				pos++;
                pSocketObj->m_MsgSendQueue.erase(pos2);
                pSocketObj->m_iSendMsgQueueCount.decrement();      //发送消息队列容量少1	
                p_Conn->psendbuf = (char *)pPkgHeader;   //要发送的数据的缓冲区指针，因为发送数据不一定全部都能发送出去，我们要记录数据发送到了哪里，需要知道下次数据从哪里开始发送
                itmp = ntohs(pPkgHeader->pkgLen);        //包头+包体 长度 ，打包时用了htons【本机序转网络序】，所以这里为了得到该数值，用了个ntohs【网络序转本机序】；
                p_Conn->isendlen = itmp;                 //要发送多少数据，因为发送数据不一定全部都能发送出去，我们需要知道剩余有多少数据还没发送
                                
                //这里是重点，我们采用 epoll水平触发的策略，能走到这里的，都应该是还没有投递 写事件 到epoll中
                    //epoll水平触发发送数据的改进方案：
	                //开始不把socket写事件通知加入到epoll,当我需要写数据的时候，直接调用write/send发送数据；
	                //如果返回了EAGIN【发送缓冲区满了，需要等待可写事件才能继续往缓冲区里写数据】，此时，我再把写事件通知加入到epoll，
	                //此时，就变成了在epoll驱动下写数据，全部数据发送完毕后，再把写事件通知从epoll中干掉；
	                //优点：数据不多的时候，可以避免epoll的写事件的增加/删除，提高了程序的执行效率；                         
                //(1)直接调用write或者send发送数据
             //   ngx_log_stderr(errno,"即将发送数据%ud。",p_Conn->isendlen);
                LOG_INFO << "即将发送数据" << p_Conn->isendlen;

                sendsize = pSocketObj->sendproc(p_Conn,p_Conn->psendbuf,p_Conn->isendlen); //注意参数
                if(sendsize > 0)
                {                    
                    if(sendsize == p_Conn->isendlen) //成功发送出去了数据，一下就发送出去这很顺利
                    {
                        //成功发送的和要求发送的数据相等，说明全部发送成功了 发送缓冲区去了【数据全部发完】
                        p_memory->FreeMemory(p_Conn->psendMemPointer);  //释放内存
                        p_Conn->psendMemPointer = NULL;
                       // p_Conn->iThrowsendCount = 0;  //这行其实可以没有，因此此时此刻这东西就是=0的                        
                        LOG_INFO << "CSocekt::ServerSendQueueThread()中数据发送完毕，很好。";
                    }
                    else  //没有全部发送完毕(EAGAIN)，数据只发出去了一部分，但肯定是因为 发送缓冲区满了,那么
                    {                        
                        //发送到了哪里，剩余多少，记录下来，方便下次sendproc()时使用
                        p_Conn->psendbuf = p_Conn->psendbuf + sendsize;
				        p_Conn->isendlen = p_Conn->isendlen - sendsize;	
                        //因为发送缓冲区慢了，所以 现在我要依赖系统通知来发送数据了
                        p_Conn->iThrowsendCount.increment();             //标记发送缓冲区满了，需要通过epoll事件来驱动消息的继续发送【原子+1，且不可写成p_Conn->iThrowsendCount = p_Conn->iThrowsendCount +1 ，这种写法不是原子+1】
                        if(pSocketObj->flyd_epoll_oper_event(
                                p_Conn->fd,         //socket句柄
                                EPOLL_CTL_MOD,      //事件类型，这里是增加【因为我们准备增加个写通知】
                                EPOLLOUT,           //标志，这里代表要增加的标志,EPOLLOUT：可写【可写的时候通知我】
                                0,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                                p_Conn              //连接池中的连接
                                ) == -1)
                        {
                            //有这情况发生？这可比较麻烦，不过先do nothing
                            LOG_ERROR << "CSocekt::ServerSendQueueThread()ngx_epoll_oper_event()失败.";
                        }
                            LOG_ERROR << "CSocekt::ServerSendQueueThread()中数据没发送完毕【发送缓冲区满】，整个要发送"<<p_Conn->isendlen << "字节， "<< "实际发送了" << sendsize;

                    } //end if(sendsize > 0)
                    continue;  //继续处理其他消息                    
                }  //end if(sendsize > 0)

                //能走到这里，应该是有点问题的
                else if(sendsize == 0)
                {
                    //发送0个字节，首先因为我发送的内容不是0个字节的；
                    //然后如果发送 缓冲区满则返回的应该是-1，而错误码应该是EAGAIN，所以我综合认为，这种情况我就把这个发送的包丢弃了【按对端关闭了socket处理】
                    //这个打印下日志，我还真想观察观察是否真有这种现象发生
                    //ngx_log_stderr(errno,"CSocekt::ServerSendQueueThread()中sendproc()居然返回0？"); //如果对方关闭连接出现send=0，那么这个日志可能会常出现，商用时就 应该干掉
                    //然后这个包干掉，不发送了
                    p_memory->FreeMemory(p_Conn->psendMemPointer);  //释放内存
                    p_Conn->psendMemPointer = NULL;
                   // p_Conn->iThrowsendCount = 0;  //这行其实可以没有，因此此时此刻这东西就是=0的    
                    continue;
                }

                //能走到这里，继续处理问题
                else if(sendsize == -1)
                {
                    //发送缓冲区已经满了【一个字节都没发出去，说明发送 缓冲区当前正好是满的】
                    p_Conn->iThrowsendCount.increment(); //标记发送缓冲区满了，需要通过epoll事件来驱动消息的继续发送
                    if(pSocketObj->flyd_epoll_oper_event(
                                p_Conn->fd,         //socket句柄
                                EPOLL_CTL_MOD,      //事件类型，这里是增加【因为我们准备增加个写通知】
                                EPOLLOUT,           //标志，这里代表要增加的标志,EPOLLOUT：可写【可写的时候通知我】
                                0,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                                p_Conn              //连接池中的连接
                                ) == -1)
                    {
                        //有这情况发生？这可比较麻烦，不过先do nothing
                        LOG_ERROR << "CSocekt::ServerSendQueueThread()中ngx_epoll_add_event()_2失败.";
                    }
                    continue;
                }

                else
                {
                    //能走到这里的，应该就是返回值-2了，一般就认为对端断开了，等待recv()来做断开socket以及回收资源
                    p_memory->FreeMemory(p_Conn->psendMemPointer);  //释放内存
                    p_Conn->psendMemPointer = NULL;
                   // p_Conn->iThrowsendCount = 0;  //这行其实可以没有，因此此时此刻这东西就是=0的  
                    continue;
                }

            } //end while(pos != posend)

            
        } //if(pSocketObj->m_iSendMsgQueueCount > 0)
    } //end while
    
    return (void*)0;
}